

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackLog.cxx
# Opt level: O2

bool __thiscall cmCPackLog::SetLogOutputFile(cmCPackLog *this,char *fname)

{
  _func_int **pp_Var1;
  cmGeneratedFileStream *this_00;
  allocator<char> local_39;
  string local_38;
  
  if (fname != (char *)0x0) {
    this_00 = (cmGeneratedFileStream *)operator_new(0x248);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,fname,&local_39);
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,&local_38,false,None);
    std::__cxx11::string::~string((string *)&local_38);
    pp_Var1 = (this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream;
    if (((&(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)pp_Var1[-3]] & 5) == 0) goto LAB_0014a3a0;
    (*pp_Var1[1])(this_00);
  }
  this_00 = (cmGeneratedFileStream *)0x0;
LAB_0014a3a0:
  SetLogOutputStream(this,(ostream *)this_00);
  if (this_00 != (cmGeneratedFileStream *)0x0) {
    this->LogOutputCleanup = true;
  }
  return this_00 != (cmGeneratedFileStream *)0x0;
}

Assistant:

bool cmCPackLog::SetLogOutputFile(const char* fname)
{
  cmGeneratedFileStream* cg = nullptr;
  if (fname) {
    cg = new cmGeneratedFileStream(fname);
  }
  if (cg && !*cg) {
    delete cg;
    cg = nullptr;
  }
  this->SetLogOutputStream(cg);
  if (!cg) {
    return false;
  }
  this->LogOutputCleanup = true;
  return true;
}